

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::Get(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *dest,SQUnsignedInteger getflags
         ,SQInteger selfidx)

{
  SQObjectType SVar1;
  _HashNode *p_Var2;
  SQString *pSVar3;
  ulong uVar4;
  bool bVar5;
  SQInteger SVar6;
  long lVar7;
  SQTable *pSVar8;
  
  SVar1 = (self->super_SQObject)._type;
  if (SVar1 == OT_STRING) {
    SVar1 = (key->super_SQObject)._type;
    if ((SVar1 >> 0x1a & 1) != 0) {
      if (SVar1 == OT_FLOAT) {
        pSVar8 = (SQTable *)(long)(key->super_SQObject)._unVal.fFloat;
      }
      else {
        pSVar8 = (key->super_SQObject)._unVal.pTable;
      }
      pSVar3 = (self->super_SQObject)._unVal.pString;
      uVar4 = pSVar3->_len;
      lVar7 = (long)&(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                     _vptr_SQRefCounted + ((long)pSVar8 >> 0x3f & uVar4);
      if (lVar7 < (long)uVar4 && -1 < lVar7) {
        SQObjectPtr::operator=(dest,(long)pSVar3->_val[lVar7]);
        return true;
      }
      goto LAB_0012605e;
    }
LAB_00125f6a:
    if ((getflags & 1) == 0) {
      SVar6 = FallBackGet(this,self,key,dest);
      if (SVar6 == 0) {
        return true;
      }
      if (SVar6 == 2) {
        return false;
      }
      bVar5 = InvokeDefaultDelegate(this,self,key,dest);
      if (bVar5) {
        return true;
      }
    }
    if ((selfidx != 0) ||
       (p_Var2 = ((this->ci->_closure).super_SQObject._unVal.pTable)->_firstfree,
       (p_Var2->key).super_SQObject._unVal.fFloat == 2.350989e-38)) goto LAB_0012605e;
    bVar5 = Get(this,(SQObjectPtr *)&(p_Var2->key).super_SQObject._unVal,key,dest,0,0x29a);
  }
  else {
    if (SVar1 != OT_ARRAY) {
      if (SVar1 == OT_CLASS) {
        bVar5 = SQClass::Get((self->super_SQObject)._unVal.pClass,key,dest);
      }
      else if (SVar1 == OT_INSTANCE) {
        bVar5 = SQInstance::Get((self->super_SQObject)._unVal.pInstance,key,dest);
      }
      else {
        if (SVar1 != OT_TABLE) goto LAB_00125f6a;
        bVar5 = SQTable::Get((self->super_SQObject)._unVal.pTable,key,dest);
      }
      if (bVar5 != false) {
        return true;
      }
      goto LAB_00125f6a;
    }
    SVar1 = (key->super_SQObject)._type;
    if ((SVar1 >> 0x1a & 1) == 0) goto LAB_00125f6a;
    if (SVar1 == OT_FLOAT) {
      SVar6 = (SQInteger)(key->super_SQObject)._unVal.fFloat;
    }
    else {
      SVar6 = (key->super_SQObject)._unVal.nInteger;
    }
    bVar5 = SQArray::Get((self->super_SQObject)._unVal.pArray,SVar6,dest);
  }
  if (bVar5 != false) {
    return true;
  }
LAB_0012605e:
  if ((getflags & 2) == 0) {
    Raise_IdxError(this,key);
  }
  return false;
}

Assistant:

bool SQVM::Get(const SQObjectPtr &self, const SQObjectPtr &key, SQObjectPtr &dest, SQUnsignedInteger getflags, SQInteger selfidx)
{
    switch(type(self)){
    case OT_TABLE:
        if(_table(self)->Get(key,dest))return true;
        break;
    case OT_ARRAY:
        if (sq_isnumeric(key)) { if (_array(self)->Get(tointeger(key), dest)) { return true; } if ((getflags & GET_FLAG_DO_NOT_RAISE_ERROR) == 0) Raise_IdxError(key); return false; }
        break;
    case OT_INSTANCE:
        if(_instance(self)->Get(key,dest)) return true;
        break;
    case OT_CLASS:
        if(_class(self)->Get(key,dest)) return true;
        break;
    case OT_STRING:
        if(sq_isnumeric(key)){
            SQInteger n = tointeger(key);
            SQInteger len = _string(self)->_len;
            if (n < 0) { n += len; }
            if (n >= 0 && n < len) {
                dest = SQInteger(_stringval(self)[n]);
                return true;
            }
            if ((getflags & GET_FLAG_DO_NOT_RAISE_ERROR) == 0) Raise_IdxError(key);
            return false;
        }
        break;
    default:break; //shut up compiler
    }
    if ((getflags & GET_FLAG_RAW) == 0) {
        switch(FallBackGet(self,key,dest)) {
            case FALLBACK_OK: return true; //okie
            case FALLBACK_NO_MATCH: break; //keep falling back
            case FALLBACK_ERROR: return false; // the metamethod failed
        }
        if(InvokeDefaultDelegate(self,key,dest)) {
            return true;
        }
    }
//#ifdef ROOT_FALLBACK
    if(selfidx == 0) {
        SQWeakRef *w = _closure(ci->_closure)->_root;
        if(type(w->_obj) != OT_NULL)
        {
            if(Get(*((const SQObjectPtr *)&w->_obj),key,dest,0,DONT_FALL_BACK)) return true;
        }

    }
//#endif
    if ((getflags & GET_FLAG_DO_NOT_RAISE_ERROR) == 0) Raise_IdxError(key);
    return false;
}